

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void vli_mult(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right)

{
  uint local_40;
  uint local_3c;
  wordcount_t k;
  wordcount_t i;
  uECC_word_t r2;
  uECC_word_t r1;
  uECC_word_t r0;
  uECC_word_t *right_local;
  uECC_word_t *left_local;
  uECC_word_t *result_local;
  
  r1 = 0;
  r2 = 0;
  r0 = (uECC_word_t)right;
  right_local = left;
  left_local = result;
  for (local_40 = 0; _k = 0, local_40 < 4; local_40 = local_40 + 1) {
    for (local_3c = 0; local_3c <= local_40; local_3c = local_3c + 1) {
      muladd(right_local[local_3c],*(uECC_word_t *)(r0 + (ulong)(local_40 - local_3c) * 8),&r1,&r2,
             (uECC_word_t *)&k);
    }
    left_local[local_40] = r1;
    r1 = r2;
    r2 = _k;
  }
  for (local_40 = 4; _k = 0, local_40 < 7; local_40 = local_40 + 1) {
    for (local_3c = local_40 - 3; local_3c < 4; local_3c = local_3c + 1) {
      muladd(right_local[local_3c],*(uECC_word_t *)(r0 + (ulong)(local_40 - local_3c) * 8),&r1,&r2,
             (uECC_word_t *)&k);
    }
    left_local[local_40] = r1;
    r1 = r2;
    r2 = _k;
  }
  left_local[7] = r1;
  return;
}

Assistant:

static void vli_mult(uECC_word_t *result, const uECC_word_t *left, const uECC_word_t *right) {
    uECC_word_t r0 = 0;
    uECC_word_t r1 = 0;
    uECC_word_t r2 = 0;
    wordcount_t i, k;

    /* Compute each digit of result in sequence, maintaining the carries. */
    for (k = 0; k < uECC_WORDS; ++k) {
        for (i = 0; i <= k; ++i) {
            muladd(left[i], right[k - i], &r0, &r1, &r2);
        }
        result[k] = r0;
        r0 = r1;
        r1 = r2;
        r2 = 0;
    }
    for (k = uECC_WORDS; k < uECC_WORDS * 2 - 1; ++k) {
        for (i = (k + 1) - uECC_WORDS; i < uECC_WORDS; ++i) {
            muladd(left[i], right[k - i], &r0, &r1, &r2);
        }
        result[k] = r0;
        r0 = r1;
        r1 = r2;
        r2 = 0;
    }
    result[uECC_WORDS * 2 - 1] = r0;
}